

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,_1,_2,_1,_1,_2> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
_set_noalias<Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>const,1,2,true>>
          (PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *this,
          DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>_> *other)

{
  Matrix<double,_1,_2,_1,_1,_2> *pMVar1;
  Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true> *src;
  assign_op<double,_double> local_19;
  EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>_> *local_18;
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>_> *other_local;
  PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *this_local;
  
  local_18 = (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>_> *)
             other;
  other_local = (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_2,_1,__1,_2>,_1,_2,_true>_>
                 *)this;
  pMVar1 = EigenBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::derived
                     ((EigenBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)this);
  src = EigenBase<Eigen::Block<const_Eigen::Matrix<double,_-1,_2,_1,_-1,_2>,_1,_2,_true>_>::derived
                  (local_18);
  internal::assign_op<double,_double>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<double,1,2,1,1,2>,Eigen::Block<Eigen::Matrix<double,_1,2,1,_1,2>const,1,2,true>,Eigen::internal::assign_op<double,double>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::derived
                     ((EigenBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC 
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }